

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::AtMatcher<iutest::detail::GtMatcher<int>>::operator()
          (AssertionResult *__return_storage_ptr__,AtMatcher<iutest::detail::GtMatcher<int>> *this,
          vector<int,_std::allocator<int>_> *actual)

{
  bool bVar1;
  GtMatcher<int> *this_00;
  const_reference actual_00;
  AssertionResult *rhs;
  string local_f0;
  AssertionResult local_d0;
  AssertionResult local_98;
  AssertionResult local_70;
  AssertionResult local_48;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *actual_local;
  AtMatcher<iutest::detail::GtMatcher<int>_> *this_local;
  
  local_20 = actual;
  actual_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (AtMatcher<iutest::detail::GtMatcher<int>_> *)__return_storage_ptr__;
  this_00 = CastToMatcher<iutest::detail::GtMatcher<int>>
                      ((GtMatcher<int> *)(this + 0x10),
                       (type **)&iutest_type_traits::enabler_t<void>::value);
  actual_00 = std::vector<int,_std::allocator<int>_>::operator[](local_20,*(size_type *)(this + 8));
  GtMatcher<int>::operator()(&local_98,this_00,actual_00);
  AssertionResult::operator!(&local_70,&local_98);
  AssertionResult::operator!(&local_48,&local_70);
  bVar1 = AssertionResult::operator_cast_to_bool(&local_48);
  AssertionResult::~AssertionResult(&local_48);
  AssertionResult::~AssertionResult(&local_70);
  AssertionResult::~AssertionResult(&local_98);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_f0,this);
    rhs = AssertionResult::operator<<(&local_d0,&local_f0);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_f0);
    AssertionResult::~AssertionResult(&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( CastToMatcher(m_expected)(actual[m_index]) )
        {
            return AssertionSuccess();
        }